

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
duckdb_fmt::v6::basic_string_view<char>::compare
          (basic_string_view<char> *this,basic_string_view<char> other)

{
  char_type *in_RDX;
  long in_RDI;
  int result;
  size_t str_size;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char_type *__s1;
  int local_24;
  
  __s1 = in_RDX;
  if (*(char_type **)(in_RDI + 8) < in_RDX) {
    __s1 = *(char_type **)(in_RDI + 8);
  }
  local_24 = std::char_traits<char>::compare
                       (__s1,(char_type *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
  if (local_24 == 0) {
    if (*(char_type **)(in_RDI + 8) == in_RDX) {
      local_24 = 0;
    }
    else {
      local_24 = 1;
      if (*(char_type **)(in_RDI + 8) < in_RDX) {
        local_24 = -1;
      }
    }
  }
  return local_24;
}

Assistant:

int compare(basic_string_view other) const {
    size_t str_size = size_ < other.size_ ? size_ : other.size_;
    int result = std::char_traits<Char>::compare(data_, other.data_, str_size);
    if (result == 0)
      result = size_ == other.size_ ? 0 : (size_ < other.size_ ? -1 : 1);
    return result;
  }